

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O1

void __thiscall
Refal2::COperationsBuilder::AddMatchRight_E
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  TQualifierIndex pCVar5;
  COperationsBuilder *pCVar6;
  COperation local_38;
  
  bVar4 = CQualifier::IsEmpty(qualifier);
  iVar2 = this->stackDepth;
  iVar3 = this->maxRuleStackDepth;
  iVar1 = iVar2 + 1;
  this->stackDepth = iVar1;
  if (bVar4) {
    if (saveInTable) {
      if (iVar3 <= iVar2) {
        this->maxRuleStackDepth = iVar1;
      }
      local_38.type = OT_MatchRightBeginSaveToTable_E;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
      local_38.type = OT_MatchRightBeginSaveToTable_V;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
      local_38.type = OT_MatchRightSaveToTable_E;
    }
    else {
      if (iVar3 <= iVar2) {
        this->maxRuleStackDepth = iVar1;
      }
      local_38.type = OT_MatchRightBegin_E;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
      local_38.type = OT_MatchRightBegin_V;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
      local_38.type = OT_MatchRight_E;
    }
    CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
  }
  else {
    if (saveInTable) {
      if (iVar3 <= iVar2) {
        this->maxRuleStackDepth = iVar1;
      }
      local_38.type = OT_MatchRightBeginSaveToTable_E;
      pCVar6 = this;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
      pCVar5 = registerQualifier(pCVar6,qualifier);
      local_38.type = OT_MatchRightWithQulifierBeginSaveToTable_V;
      pCVar6 = this;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
      (((this->operations).last)->super_COperation).field_1.qualifier = pCVar5;
      pCVar5 = registerQualifier(pCVar6,qualifier);
      local_38.type = OT_MatchRightWithQulifierSaveToTable_E;
    }
    else {
      if (iVar3 <= iVar2) {
        this->maxRuleStackDepth = iVar1;
      }
      local_38.type = OT_MatchRightBegin_E;
      pCVar6 = this;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
      pCVar5 = registerQualifier(pCVar6,qualifier);
      local_38.type = OT_MatchRightWithQulifierBegin_V;
      pCVar6 = this;
      CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
      (((this->operations).last)->super_COperation).field_1.qualifier = pCVar5;
      pCVar5 = registerQualifier(pCVar6,qualifier);
      local_38.type = OT_MatchRightWithQulifier_E;
    }
    CNodeList<Refal2::COperation>::Append(&this->operations,&local_38);
    (((this->operations).last)->super_COperation).field_1.qualifier = pCVar5;
  }
  return;
}

Assistant:

void COperationsBuilder::AddMatchRight_E( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		if( saveInTable ) {
			addOperation_VE( OT_MatchRightBeginSaveToTable_E );
			addNoArgumensOperation( OT_MatchRightBeginSaveToTable_V );
			addNoArgumensOperation( OT_MatchRightSaveToTable_E );
		} else {
			addOperation_VE( OT_MatchRightBegin_E );
			addNoArgumensOperation( OT_MatchRightBegin_V );
			addNoArgumensOperation( OT_MatchRight_E );
		}
	} else {
		if( saveInTable ) {
			addOperation_VE( OT_MatchRightBeginSaveToTable_E );
			addQualifierIndexOperation(
				OT_MatchRightWithQulifierBeginSaveToTable_V, qualifier );
			addQualifierIndexOperation( OT_MatchRightWithQulifierSaveToTable_E,
				qualifier );
		} else {
			addOperation_VE( OT_MatchRightBegin_E );
			addQualifierIndexOperation(
				OT_MatchRightWithQulifierBegin_V, qualifier );
			addQualifierIndexOperation( OT_MatchRightWithQulifier_E,
				qualifier );
		}
	}
}